

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation_method.cpp
# Opt level: O0

void mpireorderinglib::MPIX_Dist_graph_internode_cost
               (MPI_Comm dist_graph_comm,int *total_offnode_neighbors,int *max_offnode_neighbors)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  void *pvVar5;
  int *piVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long alStack_f0 [3];
  undefined1 auStack_d8 [8];
  void *local_d0;
  int *local_c8;
  long local_c0;
  undefined1 local_b4 [4];
  int local_b0;
  int node_offnode_comm_size;
  int neighbor;
  int i_1;
  int *index_of_neighbor;
  ulong uStack_98;
  int local_offnode_neighbors;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  undefined1 local_70 [4];
  uint local_6c;
  int is_weighted;
  int n_dest;
  int n_sources;
  int i;
  int *dist_graph_comm_ranks;
  int *group_ranks;
  int local_48;
  int node_group_rank;
  int node_group_size;
  int dist_graph_rank;
  MPI_Group dist_graph_group;
  MPI_Group node_group;
  MPI_Comm node_comm;
  int *piStack_20;
  int status;
  int *max_offnode_neighbors_local;
  int *total_offnode_neighbors_local;
  MPI_Comm dist_graph_comm_local;
  
  alStack_f0[2] = 0x27c8f4;
  piStack_20 = max_offnode_neighbors;
  max_offnode_neighbors_local = total_offnode_neighbors;
  total_offnode_neighbors_local = (int *)dist_graph_comm;
  MPI_Topo_test(dist_graph_comm,(long)&node_comm + 4);
  if (node_comm._4_4_ != 3) {
    alStack_f0[2] = 0x27c91b;
    __assert_fail("status == MPI_DIST_GRAPH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/Evaluation/evaluation_method.cpp"
                  ,0x4d,
                  "void mpireorderinglib::MPIX_Dist_graph_internode_cost(MPI_Comm, int *, int *)");
  }
  *max_offnode_neighbors_local = 0;
  *piStack_20 = 0;
  alStack_f0[2] = 0x27c93c;
  MPI_Comm_rank(total_offnode_neighbors_local,&node_group_rank);
  alStack_f0[2] = 0x27c955;
  MPI_Comm_split_type(total_offnode_neighbors_local,0,node_group_rank,&ompi_mpi_info_null,
                      &node_group);
  alStack_f0[2] = 0x27c962;
  MPI_Comm_group(node_group,&dist_graph_group);
  alStack_f0[2] = 0x27c96f;
  MPI_Group_size(dist_graph_group,&local_48);
  alStack_f0[2] = 0x27c97c;
  MPI_Group_rank(dist_graph_group,(long)&group_ranks + 4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_48;
  uVar8 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  alStack_f0[2] = 0x27c9a1;
  dist_graph_comm_ranks = (int *)operator_new__(uVar8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)local_48;
  uVar8 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  alStack_f0[2] = 0x27c9ca;
  _n_sources = operator_new__(uVar8);
  alStack_f0[2] = 0x27c9db;
  MPI_Comm_group(total_offnode_neighbors_local,&node_group_size);
  for (n_dest = 0; n_dest < local_48; n_dest = n_dest + 1) {
    dist_graph_comm_ranks[n_dest] = n_dest;
  }
  alStack_f0[2] = 0x27ca1b;
  MPI_Group_translate_ranks
            (dist_graph_group,local_48,dist_graph_comm_ranks,_node_group_size,_n_sources);
  alStack_f0[2] = 0x27ca30;
  MPI_Dist_graph_neighbors_count(total_offnode_neighbors_local,&is_weighted,&local_6c,local_70);
  piVar6 = total_offnode_neighbors_local;
  uVar4 = local_6c;
  __vla_expr1 = (unsigned_long)(uint)is_weighted;
  lVar1 = __vla_expr1 * 4;
  __vla_expr2 = (unsigned_long)local_6c;
  local_c0 = (long)(auStack_d8 + -(lVar1 + 0xfU & 0xfffffffffffffff0)) -
             (__vla_expr2 * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr3 = (unsigned_long)(uint)is_weighted;
  lVar10 = local_c0 - (__vla_expr3 * 4 + 0xf & 0xfffffffffffffff0);
  uStack_98 = (ulong)local_6c;
  lVar9 = lVar10 - (uStack_98 * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr0 = (unsigned_long)auStack_d8;
  *(long *)(lVar9 + -0x10) = lVar9;
  *(undefined8 *)(lVar9 + -0x18) = 0x27cace;
  MPI_Dist_graph_neighbors
            (piVar6,is_weighted,auStack_d8 + -(lVar1 + 0xfU & 0xfffffffffffffff0),lVar10,uVar4);
  index_of_neighbor._4_4_ = 0;
  for (node_offnode_comm_size = 0; node_offnode_comm_size < (int)local_6c;
      node_offnode_comm_size = node_offnode_comm_size + 1) {
    local_b0 = *(int *)(local_c0 + (long)node_offnode_comm_size * 4);
    if (local_b0 != -2) {
      *(undefined8 *)(lVar9 + -8) = 0x27cb36;
      _neighbor = std::find<int*,int>(*(int **)(lVar9 + 0x28),*(int **)(lVar9 + 0x20),
                                      *(int **)(lVar9 + 0x18));
      if (_neighbor == (int *)((long)_n_sources + (long)local_48 * 4)) {
        index_of_neighbor._4_4_ = index_of_neighbor._4_4_ + 1;
      }
    }
  }
  *(undefined8 *)(lVar9 + -8) = 0x27cba7;
  MPI_Allreduce((long)&index_of_neighbor + 4,local_b4,1,&ompi_mpi_int,&ompi_mpi_op_sum,node_group);
  piVar7 = total_offnode_neighbors_local;
  piVar6 = piStack_20;
  *(undefined8 *)(lVar9 + -8) = 0x27cbce;
  MPI_Allreduce(local_b4,piVar6,1,&ompi_mpi_int,&ompi_mpi_op_max,piVar7);
  piVar7 = total_offnode_neighbors_local;
  piVar6 = max_offnode_neighbors_local;
  *(undefined8 *)(lVar9 + -8) = 0x27cbf5;
  MPI_Allreduce((long)&index_of_neighbor + 4,piVar6,1,&ompi_mpi_int,&ompi_mpi_op_sum,piVar7);
  piVar6 = dist_graph_comm_ranks;
  local_c8 = dist_graph_comm_ranks;
  if (dist_graph_comm_ranks != (int *)0x0) {
    *(undefined8 *)(lVar9 + -8) = 0x27cc12;
    operator_delete__(piVar6);
  }
  pvVar5 = _n_sources;
  local_d0 = _n_sources;
  if (_n_sources != (void *)0x0) {
    *(undefined8 *)(lVar9 + -8) = 0x27cc2f;
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

void mpireorderinglib::MPIX_Dist_graph_internode_cost(MPI_Comm dist_graph_comm,
													  int *total_offnode_neighbors,
													  int *max_offnode_neighbors) {
  int status;
  MPI_Topo_test(dist_graph_comm, &status);
  assert(status == MPI_DIST_GRAPH);
  CARTREORDER_INFO("Value written in total before " + std::to_string(*total_offnode_neighbors));
  CARTREORDER_INFO("Value written in max before " + std::to_string(*max_offnode_neighbors));
  *total_offnode_neighbors = 0;
  *max_offnode_neighbors = 0;

  //find out which processes are on the same node
  MPI_Comm node_comm;
  MPI_Group node_group;
  MPI_Group dist_graph_group;

  int dist_graph_rank;
  MPI_Comm_rank(dist_graph_comm, &dist_graph_rank);

  MPI_Comm_split_type(dist_graph_comm, MPI_COMM_TYPE_SHARED,
					  dist_graph_rank, MPI_INFO_NULL, &node_comm);

  int node_group_size, node_group_rank;

  //extract the corresponding groups
  MPI_Comm_group(node_comm, &node_group);
  MPI_Group_size(node_group, &node_group_size);
  MPI_Group_rank(node_group, &node_group_rank);

  int *const group_ranks = new int[node_group_size];
  int *const dist_graph_comm_ranks = new int[node_group_size];

  MPI_Comm_group(dist_graph_comm, &dist_graph_group);

  //initialize node group ranks array
  for (int i{0}; i < node_group_size; i++) {
	group_ranks[i] = i;
  }

  //translate the ranks in the group to the ranks
  //in the old communicator dist_graph_comm
  MPI_Group_translate_ranks(node_group, node_group_size,
							group_ranks, dist_graph_group, dist_graph_comm_ranks);

  int n_sources, n_dest, is_weighted;
  MPI_Dist_graph_neighbors_count(dist_graph_comm, &n_sources,
								 &n_dest, &is_weighted);

  //Each process only counts the communication he starts
  //Good idea to do so?
  int sources[n_sources];
  int dest[n_dest];
  int source_weights[n_sources];
  int dest_weights[n_dest];

  MPI_Dist_graph_neighbors(dist_graph_comm, n_sources, sources,
						   source_weights, n_dest, dest, dest_weights);

  //Explicitly reset the neighbor count and start from
  //zero. Anotherwise one would count MPI_PROC_NULL.
  //Start locally und communicate globally.
  int local_offnode_neighbors = 0;
  int *index_of_neighbor;

  // Another assumption was made, that the number on each
  // process is small. Meaning we have
  // O(num_oncore_pe*neighbors) operations. No presorting
  // of neighbors is done.
  // Only the destination targets are counted
  for (int i{0}; i < n_dest; i++) {
	int neighbor = dest[i];
	if (neighbor == MPI_PROC_NULL)
	  continue;

	index_of_neighbor = std::find(dist_graph_comm_ranks,
								  dist_graph_comm_ranks + node_group_size,
								  neighbor);

	//Increase offnode neighbor count if no index
	//was found
	if (index_of_neighbor == dist_graph_comm_ranks + node_group_size) {
	  local_offnode_neighbors += 1;
	}
  }

  CARTREORDER_INFO("Rank " + std::to_string(dist_graph_rank) + " has " + std::to_string(local_offnode_neighbors) + " off node neighbors");

  int node_offnode_comm_size;
  MPI_Allreduce(&local_offnode_neighbors,
				&node_offnode_comm_size,
				1, MPI_INT, MPI_SUM, node_comm);

  //Communicate max offnode neighbors
  MPI_Allreduce(&node_offnode_comm_size,
				max_offnode_neighbors,
				1, MPI_INT, MPI_MAX, dist_graph_comm);

  //Communciate local offnode neighbors to everybody
  //sum up and devide by two. Symmetry assumption
  MPI_Allreduce(&local_offnode_neighbors,
				total_offnode_neighbors,
				1, MPI_INT, MPI_SUM, dist_graph_comm);

  delete[] group_ranks;
  delete[] dist_graph_comm_ranks;
}